

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glTF2Exporter.cpp
# Opt level: O0

uint __thiscall Assimp::glTF2Exporter::ExportNodeHierarchy(glTF2Exporter *this,aiNode *n)

{
  bool bVar1;
  uint uVar2;
  element_type *peVar3;
  element_type *this_00;
  char *pcVar4;
  Node *pNVar5;
  aiMatrix4x4 *v;
  Ref<glTF2::Node> RVar6;
  Ref<glTF2::Mesh> RVar7;
  value_type local_d0;
  uint local_c0;
  uint local_bc;
  uint idx;
  uint i_1;
  uint local_b0;
  value_type local_a8;
  uint local_94;
  vector<glTF2::Node_*,_std::allocator<glTF2::Node_*>_> *pvStack_90;
  uint i;
  uint local_88;
  allocator local_69;
  string local_68;
  string local_48;
  undefined1 local_28 [8];
  Ref<glTF2::Node> node;
  aiNode *n_local;
  glTF2Exporter *this_local;
  
  node._8_8_ = n;
  peVar3 = std::__shared_ptr_access<glTF2::Asset,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<glTF2::Asset,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                      )&this->mAsset);
  this_00 = std::__shared_ptr_access<glTF2::Asset,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<glTF2::Asset,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)&this->mAsset);
  pcVar4 = aiString::C_Str((aiString *)node._8_8_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_68,pcVar4,&local_69);
  glTF2::Asset::FindUniqueID(&local_48,this_00,&local_68,"node");
  RVar6 = glTF2::LazyDict<glTF2::Node>::Create(&peVar3->nodes,&local_48);
  pvStack_90 = RVar6.vector;
  local_88 = RVar6.index;
  local_28 = (undefined1  [8])pvStack_90;
  node.vector._0_4_ = local_88;
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  pcVar4 = aiString::C_Str((aiString *)node._8_8_);
  pNVar5 = glTF2::Ref<glTF2::Node>::operator->((Ref<glTF2::Node> *)local_28);
  std::__cxx11::string::operator=((string *)&(pNVar5->super_Object).name,pcVar4);
  bVar1 = aiMatrix4x4t<float>::IsIdentity((aiMatrix4x4t<float> *)(node._8_8_ + 0x404));
  if (!bVar1) {
    pNVar5 = glTF2::Ref<glTF2::Node>::operator->((Ref<glTF2::Node> *)local_28);
    (pNVar5->matrix).isPresent = true;
    v = (aiMatrix4x4 *)(node._8_8_ + 0x404);
    pNVar5 = glTF2::Ref<glTF2::Node>::operator->((Ref<glTF2::Node> *)local_28);
    CopyValue(v,(pNVar5->matrix).value);
  }
  for (local_94 = 0; local_94 < *(uint *)(node._8_8_ + 0x460); local_94 = local_94 + 1) {
    pNVar5 = glTF2::Ref<glTF2::Node>::operator->((Ref<glTF2::Node> *)local_28);
    peVar3 = std::__shared_ptr_access<glTF2::Asset,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<glTF2::Asset,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->mAsset);
    RVar7 = glTF2::LazyDict<glTF2::Mesh>::Get
                      (&peVar3->meshes,
                       *(uint *)(*(long *)(node._8_8_ + 0x468) + (ulong)local_94 * 4));
    _idx = RVar7.vector;
    local_b0 = RVar7.index;
    local_a8.vector = _idx;
    local_a8.index = local_b0;
    std::vector<glTF2::Ref<glTF2::Mesh>,_std::allocator<glTF2::Ref<glTF2::Mesh>_>_>::push_back
              (&pNVar5->meshes,&local_a8);
  }
  for (local_bc = 0; local_bc < *(uint *)(node._8_8_ + 0x450); local_bc = local_bc + 1) {
    local_c0 = ExportNode(this,*(aiNode **)(*(long *)(node._8_8_ + 0x458) + (ulong)local_bc * 8),
                          (Ref<glTF2::Node> *)local_28);
    pNVar5 = glTF2::Ref<glTF2::Node>::operator->((Ref<glTF2::Node> *)local_28);
    peVar3 = std::__shared_ptr_access<glTF2::Asset,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<glTF2::Asset,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->mAsset);
    RVar6 = glTF2::LazyDict<glTF2::Node>::Get(&peVar3->nodes,local_c0);
    local_d0.vector = RVar6.vector;
    local_d0.index = RVar6.index;
    std::vector<glTF2::Ref<glTF2::Node>,_std::allocator<glTF2::Ref<glTF2::Node>_>_>::push_back
              (&pNVar5->children,&local_d0);
  }
  uVar2 = glTF2::Ref<glTF2::Node>::GetIndex((Ref<glTF2::Node> *)local_28);
  return uVar2;
}

Assistant:

unsigned int glTF2Exporter::ExportNodeHierarchy(const aiNode* n)
{
    Ref<Node> node = mAsset->nodes.Create(mAsset->FindUniqueID(n->mName.C_Str(), "node"));

    node->name = n->mName.C_Str();

    if (!n->mTransformation.IsIdentity()) {
        node->matrix.isPresent = true;
        CopyValue(n->mTransformation, node->matrix.value);
    }

    for (unsigned int i = 0; i < n->mNumMeshes; ++i) {
        node->meshes.push_back(mAsset->meshes.Get(n->mMeshes[i]));
    }

    for (unsigned int i = 0; i < n->mNumChildren; ++i) {
        unsigned int idx = ExportNode(n->mChildren[i], node);
        node->children.push_back(mAsset->nodes.Get(idx));
    }

    return node.GetIndex();
}